

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino.c
# Opt level: O3

void params_enumerate(DHANDLE dhandle,dino_enum_func callback,void *obj)

{
  dino_http_data_t *ptr;
  DHANDLE local_40;
  dino_callback_param_t callback_data;
  
  if ((dhandle != (DHANDLE)0x0) && (*dhandle == 2)) {
    memory_clear(&local_40,0x18);
    local_40 = dhandle;
    callback_data.dhandle = callback;
    callback_data.callback = (dino_enum_func)obj;
    dino_strmap_enum(*(str_map_t **)((long)dhandle + 0x28),param_enum,&local_40);
  }
  return;
}

Assistant:

void DINO_EXPORT params_enumerate(DHANDLE dhandle, dino_enum_func callback, const void *obj) {
    dino_http_request_t *request = cast_dhandle_request(dhandle);

    if (NULL != request) {
        dino_callback_param_t callback_data;
        memory_clear(&callback_data, sizeof(dino_callback_param_t));
        callback_data.callback = callback;
        callback_data.dhandle = dhandle;
        callback_data.obj = obj;

        dino_strmap_enum(request->params_map, param_enum, &callback_data);

    }
}